

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O2

void __thiscall QProgressDialog::setBar(QProgressDialog *this,QProgressBar *bar)

{
  QProgressDialogPrivate *this_00;
  QProgressBar *pQVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (bar == (QProgressBar *)0x0) {
    pcVar2 = "QProgressDialog::setBar: Cannot set a null progress bar";
  }
  else {
    this_00 = *(QProgressDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
    pQVar1 = this_00->bar;
    if (pQVar1 != bar) {
      if (pQVar1 != (QProgressBar *)0x0) {
        (**(code **)(*(long *)&pQVar1->super_QWidget + 0x20))();
      }
      this_00->bar = bar;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QProgressDialogPrivate::adoptChildWidget(this_00,&bar->super_QWidget);
        return;
      }
      goto LAB_004bf63c;
    }
    pcVar2 = "QProgressDialog::setBar: Attempt to set the same progress bar again";
  }
  local_20 = "default";
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0] = '\x02';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  QMessageLogger::warning(local_38,pcVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_004bf63c:
  __stack_chk_fail();
}

Assistant:

void QProgressDialog::setBar(QProgressBar *bar)
{
    Q_D(QProgressDialog);
    if (Q_UNLIKELY(!bar)) {
        qWarning("QProgressDialog::setBar: Cannot set a null progress bar");
        return;
    }
#ifndef QT_NO_DEBUG
    if (Q_UNLIKELY(value() > 0))
        qWarning("QProgressDialog::setBar: Cannot set a new progress bar "
                  "while the old one is active");
#endif
    if (Q_UNLIKELY(bar == d->bar)) {
        qWarning("QProgressDialog::setBar: Attempt to set the same progress bar again");
        return;
    }
    delete d->bar;
    d->bar = bar;
    d->adoptChildWidget(bar);
}